

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

size_t __thiscall
mocker::ir::Builder::getTypeSize(Builder *this,shared_ptr<mocker::ast::Type> *type)

{
  element_type *peVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t unaff_R14;
  bool bVar4;
  
  peVar1 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(peVar1,&ast::Type::typeinfo,&ast::BuiltinType::typeinfo,0);
  }
  if (lVar2 == 0) {
    lVar2 = 0;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var3 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
  }
  if (lVar2 != 0) {
    unaff_R14 = 0x10;
    if (*(int *)(lVar2 + 0x18) != 2) {
      if (*(int *)(lVar2 + 0x18) == 0) {
        __assert_fail("p->type != ast::BuiltinType::Null",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                      ,0x3df,
                      "std::size_t mocker::ir::Builder::getTypeSize(const std::shared_ptr<ast::Type> &) const"
                     );
      }
      unaff_R14 = 8;
    }
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (lVar2 == 0) {
    peVar1 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = __dynamic_cast(peVar1,&ast::Type::typeinfo,&ast::UserDefinedType::typeinfo,0);
    }
    if (lVar2 == 0) {
      lVar2 = 0;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var3 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
    }
    if (lVar2 != 0) {
      unaff_R14 = BuilderContext::getClassSize(this->ctx,(string *)(*(long *)(lVar2 + 0x18) + 0x18))
      ;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (lVar2 == 0) {
      peVar1 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        bVar4 = false;
      }
      else {
        lVar2 = __dynamic_cast(peVar1,&ast::Type::typeinfo,&ast::ArrayType::typeinfo,0);
        bVar4 = lVar2 != 0;
      }
      if (bVar4) {
        p_Var3 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        unaff_R14 = 0x10;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
      }
      else {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (!bVar4) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                      ,1000,
                      "std::size_t mocker::ir::Builder::getTypeSize(const std::shared_ptr<ast::Type> &) const"
                     );
      }
    }
  }
  return unaff_R14;
}

Assistant:

std::size_t Builder::getTypeSize(const std::shared_ptr<ast::Type> &type) const {
  if (auto p = std::dynamic_pointer_cast<ast::BuiltinType>(type)) {
    if (p->type == ast::BuiltinType::String)
      return 16;
    assert(p->type != ast::BuiltinType::Null);
    return 8;
  }
  if (auto p = std::dynamic_pointer_cast<ast::UserDefinedType>(type)) {
    return ctx.getClassSize(p->name->val);
  }
  if (auto p = std::dynamic_pointer_cast<ast::ArrayType>(type)) {
    return 16;
  }
  assert(false);
}